

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_primary(LexState *ls,ExpDesc *v)

{
  undefined8 *in_RDI;
  ExpDesc key_1;
  ExpDesc key;
  BCLine line;
  FuncState *fs;
  FuncState *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  BCLine in_stack_ffffffffffffffb4;
  LexToken in_stack_ffffffffffffffb8;
  LexToken in_stack_ffffffffffffffbc;
  FuncState *in_stack_ffffffffffffffc0;
  FuncState *in_stack_ffffffffffffffc8;
  LexState *in_stack_ffffffffffffffd0;
  ExpDesc *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (*(int *)((long)in_RDI + 0x24) == 0x28) {
    in_stack_ffffffffffffffe4 = *(undefined4 *)(in_RDI + 0xb);
    lj_lex_next((LexState *)0x12b2cc);
    expr((LexState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
         (ExpDesc *)in_stack_ffffffffffffffa8);
    lex_match((LexState *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
              in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    expr_discharge((FuncState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (ExpDesc *)in_stack_ffffffffffffffa8);
  }
  else {
    if (*(int *)((long)in_RDI + 0x24) != 0x11f) {
      err_syntax((LexState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (ErrMsg)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    }
    in_stack_ffffffffffffffa8 = (FuncState *)*in_RDI;
    lex_str((LexState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    var_lookup_(in_stack_ffffffffffffffc8,(GCstr *)in_stack_ffffffffffffffc0,
                (ExpDesc *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                in_stack_ffffffffffffffb4);
  }
  while( true ) {
    while( true ) {
      while( true ) {
        while (*(int *)((long)in_RDI + 0x24) == 0x2e) {
          expr_field(in_stack_ffffffffffffffd0,(ExpDesc *)in_stack_ffffffffffffffc8);
        }
        if (*(int *)((long)in_RDI + 0x24) != 0x5b) break;
        expr_toanyreg(in_stack_ffffffffffffffa8,(ExpDesc *)0x12b38f);
        expr_bracket((LexState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (ExpDesc *)in_stack_ffffffffffffffa8);
        expr_index(in_stack_ffffffffffffffc8,(ExpDesc *)in_stack_ffffffffffffffc0,
                   (ExpDesc *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
      if (*(int *)((long)in_RDI + 0x24) != 0x3a) break;
      lj_lex_next((LexState *)0x12b3cc);
      expr_str((LexState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (ExpDesc *)in_stack_ffffffffffffffa8);
      bcemit_method(in_stack_ffffffffffffffc0,
                    (ExpDesc *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (ExpDesc *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      parse_args((LexState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffd8);
    }
    if (((*(int *)((long)in_RDI + 0x24) != 0x28) && (*(int *)((long)in_RDI + 0x24) != 0x120)) &&
       (*(int *)((long)in_RDI + 0x24) != 0x7b)) break;
    expr_tonextreg((FuncState *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (ExpDesc *)in_stack_ffffffffffffffa8);
    parse_args((LexState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void expr_primary(LexState *ls, ExpDesc *v)
{
  FuncState *fs = ls->fs;
  /* Parse prefix expression. */
  if (ls->token == '(') {
    BCLine line = ls->linenumber;
    lj_lex_next(ls);
    expr(ls, v);
    lex_match(ls, ')', '(', line);
    expr_discharge(ls->fs, v);
  } else if (ls->token == TK_name || (!LJ_52 && ls->token == TK_goto)) {
    var_lookup(ls, v);
  } else {
    err_syntax(ls, LJ_ERR_XSYMBOL);
  }
  for (;;) {  /* Parse multiple expression suffixes. */
    if (ls->token == '.') {
      expr_field(ls, v);
    } else if (ls->token == '[') {
      ExpDesc key;
      expr_toanyreg(fs, v);
      expr_bracket(ls, &key);
      expr_index(fs, v, &key);
    } else if (ls->token == ':') {
      ExpDesc key;
      lj_lex_next(ls);
      expr_str(ls, &key);
      bcemit_method(fs, v, &key);
      parse_args(ls, v);
    } else if (ls->token == '(' || ls->token == TK_string || ls->token == '{') {
      expr_tonextreg(fs, v);
      parse_args(ls, v);
    } else {
      break;
    }
  }
}